

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O2

void print_opt_binp(uchar *val,size_t val_len)

{
  size_t sVar1;
  
  putchar(0x22);
  for (sVar1 = 0; val_len != sVar1; sVar1 = sVar1 + 1) {
    if (val[sVar1] - 0x7f < 0xffffffa1) {
      printf("\\%03d");
    }
    else {
      putchar((uint)val[sVar1]);
    }
  }
  putchar(0x22);
  return;
}

Assistant:

static void print_opt_binp(const unsigned char *val, size_t val_len)
{
  size_t i;
  printf("\"");
  for (i = 0; i < val_len; i++) {
    if (adig_isprint(val[i])) {
      printf("%c", val[i]);
    } else {
      printf("\\%03d", val[i]);
    }
  }
  printf("\"");
}